

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_csr.c
# Opt level: O1

int mbedtls_x509_csr_parse_der(mbedtls_x509_csr *csr,uchar *buf,size_t buflen)

{
  int *val;
  int iVar1;
  uchar *puVar2;
  uchar *p;
  size_t len;
  mbedtls_x509_buf sig_params;
  uchar *local_58;
  size_t local_50;
  mbedtls_x509_buf local_48;
  
  local_48.tag = 0;
  local_48._4_4_ = 0;
  local_48.len = 0;
  local_48.p = (uchar *)0x0;
  if (buflen == 0 || (buf == (uchar *)0x0 || csr == (mbedtls_x509_csr *)0x0)) {
    return -0x2800;
  }
  memset(csr,0,0xe0);
  local_50 = buflen;
  puVar2 = (uchar *)calloc(1,buflen);
  if (puVar2 == (uchar *)0x0) {
    return -0x2880;
  }
  local_58 = puVar2;
  memcpy(puVar2,buf,buflen);
  (csr->raw).p = puVar2;
  (csr->raw).len = buflen;
  puVar2 = puVar2 + buflen;
  iVar1 = mbedtls_asn1_get_tag(&local_58,puVar2,&local_50,0x30);
  if (iVar1 != 0) {
    mbedtls_x509_csr_free(csr);
    return -0x2180;
  }
  if (local_50 != (long)puVar2 - (long)local_58) {
LAB_00112217:
    mbedtls_x509_csr_free(csr);
    return -0x21e6;
  }
  (csr->cri).p = local_58;
  iVar1 = mbedtls_asn1_get_tag(&local_58,puVar2,&local_50,0x30);
  if (iVar1 == 0) {
    puVar2 = local_58 + local_50;
    (csr->cri).len = (long)puVar2 - (long)(csr->cri).p;
    val = &csr->version;
    iVar1 = mbedtls_asn1_get_int(&local_58,puVar2,val);
    if (iVar1 != 0) {
      if (iVar1 == -0x62) {
        *val = 0;
        iVar1 = 0;
      }
      else {
        iVar1 = iVar1 + -0x2200;
      }
    }
    if (iVar1 == 0) {
      iVar1 = *val;
      *val = iVar1 + 1;
      if (iVar1 != 0) {
        mbedtls_x509_csr_free(csr);
        return -0x2580;
      }
      (csr->subject_raw).p = local_58;
      iVar1 = mbedtls_asn1_get_tag(&local_58,puVar2,&local_50,0x30);
      if (iVar1 != 0) goto LAB_0011208d;
      iVar1 = mbedtls_x509_get_name(&local_58,local_58 + local_50,&csr->subject);
      if (iVar1 == 0) {
        (csr->subject_raw).len = (long)local_58 - (long)(csr->subject_raw).p;
        iVar1 = mbedtls_pk_parse_subpubkey(&local_58,puVar2,&csr->pk);
        if (iVar1 == 0) {
          iVar1 = mbedtls_asn1_get_tag(&local_58,puVar2,&local_50,0xa0);
          if (iVar1 != 0) goto LAB_0011208d;
          local_58 = local_58 + local_50;
          puVar2 = (csr->raw).p + (csr->raw).len;
          iVar1 = mbedtls_x509_get_alg(&local_58,puVar2,&csr->sig_oid,&local_48);
          if (iVar1 == 0) {
            iVar1 = mbedtls_x509_get_sig_alg
                              (&csr->sig_oid,&local_48,&csr->sig_md,&csr->sig_pk,&csr->sig_opts);
            if (iVar1 != 0) {
              mbedtls_x509_csr_free(csr);
              return -0x2600;
            }
            iVar1 = mbedtls_x509_get_sig(&local_58,puVar2,&csr->sig);
            if (iVar1 == 0) {
              if (local_58 == puVar2) {
                return 0;
              }
              goto LAB_00112217;
            }
          }
        }
      }
    }
    mbedtls_x509_csr_free(csr);
  }
  else {
LAB_0011208d:
    mbedtls_x509_csr_free(csr);
    iVar1 = iVar1 + -0x2180;
  }
  return iVar1;
}

Assistant:

int mbedtls_x509_csr_parse_der( mbedtls_x509_csr *csr,
                        const unsigned char *buf, size_t buflen )
{
    int ret;
    size_t len;
    unsigned char *p, *end;
    mbedtls_x509_buf sig_params;

    memset( &sig_params, 0, sizeof( mbedtls_x509_buf ) );

    /*
     * Check for valid input
     */
    if( csr == NULL || buf == NULL || buflen == 0 )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    mbedtls_x509_csr_init( csr );

    /*
     * first copy the raw DER data
     */
    p = mbedtls_calloc( 1, len = buflen );

    if( p == NULL )
        return( MBEDTLS_ERR_X509_ALLOC_FAILED );

    memcpy( p, buf, buflen );

    csr->raw.p = p;
    csr->raw.len = len;
    end = p + len;

    /*
     *  CertificationRequest ::= SEQUENCE {
     *       certificationRequestInfo CertificationRequestInfo,
     *       signatureAlgorithm AlgorithmIdentifier,
     *       signature          BIT STRING
     *  }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT );
    }

    if( len != (size_t) ( end - p ) )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    /*
     *  CertificationRequestInfo ::= SEQUENCE {
     */
    csr->cri.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    end = p + len;
    csr->cri.len = end - csr->cri.p;

    /*
     *  Version  ::=  INTEGER {  v1(0) }
     */
    if( ( ret = x509_csr_get_version( &p, end, &csr->version ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( ret );
    }

    csr->version++;

    if( csr->version != 1 )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_UNKNOWN_VERSION );
    }

    /*
     *  subject               Name
     */
    csr->subject_raw.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    if( ( ret = mbedtls_x509_get_name( &p, p + len, &csr->subject ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( ret );
    }

    csr->subject_raw.len = p - csr->subject_raw.p;

    /*
     *  subjectPKInfo SubjectPublicKeyInfo
     */
    if( ( ret = mbedtls_pk_parse_subpubkey( &p, end, &csr->pk ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( ret );
    }

    /*
     *  attributes    [0] Attributes
     *
     *  The list of possible attributes is open-ended, though RFC 2985
     *  (PKCS#9) defines a few in section 5.4. We currently don't support any,
     *  so we just ignore them. This is a safe thing to do as the worst thing
     *  that could happen is that we issue a certificate that does not match
     *  the requester's expectations - this cannot cause a violation of our
     *  signature policies.
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_CONTEXT_SPECIFIC ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    p += len;

    end = csr->raw.p + csr->raw.len;

    /*
     *  signatureAlgorithm   AlgorithmIdentifier,
     *  signature            BIT STRING
     */
    if( ( ret = mbedtls_x509_get_alg( &p, end, &csr->sig_oid, &sig_params ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( ret );
    }

    if( ( ret = mbedtls_x509_get_sig_alg( &csr->sig_oid, &sig_params,
                                  &csr->sig_md, &csr->sig_pk,
                                  &csr->sig_opts ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG );
    }

    if( ( ret = mbedtls_x509_get_sig( &p, end, &csr->sig ) ) != 0 )
    {
        mbedtls_x509_csr_free( csr );
        return( ret );
    }

    if( p != end )
    {
        mbedtls_x509_csr_free( csr );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    return( 0 );
}